

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitTry(BinaryInstWriter *this,Try *curr)

{
  pointer *ppNVar1;
  iterator __position;
  char *pcVar2;
  uchar local_19;
  
  __position._M_current =
       (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->breakStack,__position,
               &curr->name);
  }
  else {
    pcVar2 = (curr->name).super_IString.str._M_str;
    ((__position._M_current)->super_IString).str._M_len = (curr->name).super_IString.str._M_len;
    ((__position._M_current)->super_IString).str._M_str = pcVar2;
    ppNVar1 = &(this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  local_19 = '\x06';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  emitResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)52>).
                            super_Expression.type.id);
  return;
}

Assistant:

void BinaryInstWriter::visitTry(Try* curr) {
  breakStack.push_back(curr->name);
  o << int8_t(BinaryConsts::Try);
  emitResultType(curr->type);
}